

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicMapReader.cpp
# Opt level: O2

void __thiscall
tiger::trains::convertors::json::DynamicMapReader::readEvent
          (DynamicMapReader *this,json *jevent,EventModel *event)

{
  int iVar1;
  EventType EVar2;
  const_reference pvVar3;
  
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)jevent,"tick");
  iVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<int,_int,_0>(pvVar3);
  models::EventModel::setTick(event,iVar1);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)jevent,"type");
  EVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<tiger::trains::models::EventType,_tiger::trains::models::EventType,_0>(pvVar3);
  models::EventModel::setType(event,EVar2);
  EVar2 = models::EventModel::getType(event);
  if (EVar2 - TRAIN_COLLISION < 4) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)jevent,
                        &DAT_0017dce4 +
                        *(int *)(&DAT_0017dce4 + (ulong)(EVar2 - TRAIN_COLLISION) * 4));
    iVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<int,_int,_0>(pvVar3);
    models::EventModel::setParametrs(event,iVar1);
    return;
  }
  return;
}

Assistant:

void DynamicMapReader::readEvent(const nlohmann::json &jevent, models::EventModel *event)
{
    event->setTick(jevent["tick"]);
    event->setType(jevent["type"]);

    switch (event->getType())
    {
    case models::EventType::HIJACKERS_ASSAULT:
        event->setParametrs(jevent["hijackers_power"]);
        break;

    case models::EventType::PARASITES_ASSAULT:
        event->setParametrs(jevent["parasites_power"]);
        break;

    case models::EventType::REFUGEES_ARRIVAL:
        event->setParametrs(jevent["refugees_number"]);
        break;

    case models::EventType::TRAIN_COLLISION:
        event->setParametrs(jevent["train"]);
        break;

    default:
        break;
    }
}